

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer.cpp
# Opt level: O2

void Fossilize::ExternalReplayer::compute_condensed_progress
               (Progress *progress,uint *completed,uint *total)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  uVar1 = progress->total_modules;
  uVar2 = (progress->graphics).cached;
  uVar3 = (progress->graphics).skipped;
  uVar10 = uVar3 + uVar2;
  uVar13 = 0;
  uVar11 = progress->total_graphics_pipeline_blobs - uVar10;
  if (progress->total_graphics_pipeline_blobs < uVar10) {
    uVar11 = uVar13;
  }
  uVar4 = (progress->compute).cached;
  uVar5 = (progress->compute).completed;
  uVar6 = (progress->compute).skipped;
  uVar10 = uVar6 + uVar4;
  uVar15 = progress->total_compute_pipeline_blobs - uVar10;
  if (progress->total_compute_pipeline_blobs < uVar10) {
    uVar15 = uVar13;
  }
  uVar7 = (progress->raytracing).cached;
  uVar8 = (progress->raytracing).skipped;
  uVar10 = uVar8 + uVar7;
  uVar14 = progress->total_raytracing_pipeline_blobs - uVar10;
  if (progress->total_raytracing_pipeline_blobs < uVar10) {
    uVar14 = uVar13;
  }
  uVar10 = progress->module_validation_failures + progress->completed_modules +
           progress->banned_modules + progress->missing_modules;
  if (uVar1 < uVar10) {
    uVar10 = uVar1;
  }
  uVar13 = (progress->graphics).completed;
  if (uVar11 < uVar13) {
    uVar13 = uVar11;
  }
  if (uVar15 < uVar5) {
    uVar5 = uVar15;
  }
  uVar9 = (progress->raytracing).completed;
  if (uVar14 < uVar9) {
    uVar9 = uVar14;
  }
  *completed = uVar5 + uVar13 + uVar9 + (uVar10 + 9) / 10;
  *total = uVar15 + uVar11 + uVar14 + (uVar1 + 9) / 10;
  iVar12 = (uVar4 + uVar6 + 99) / 100 + (uVar2 + uVar3 + 99) / 100 + (uVar7 + uVar8 + 99) / 100;
  *completed = *completed + iVar12;
  *total = *total + iVar12;
  return;
}

Assistant:

void ExternalReplayer::compute_condensed_progress(const Progress &progress, unsigned &completed, unsigned &total)
{
	// Some pipelines might be compiled twice if they are derivable pipelines especially when using multi-process replays.
	// There are also shenanigans when pipelines are compiled multiple times as a result of crash recoveries.
	// We do not know ahead of time how many modules we are going to compile from the archive.
	// This depends entirely on which modules the pipelines refer to.
	// Due to all these quirks, it is somewhat complicated to provide an accurate metric on completion.

	// As modules are pulled in, they increase the total progress.
	// Since it may look like progress is moving backwards in this scenario,
	// it's better to heavily discount shader module progress.
	constexpr unsigned ModuleWeightDivider = 10;
	unsigned weighted_total_modules = (progress.total_modules + ModuleWeightDivider - 1) / ModuleWeightDivider;

	// Skipped pipelines (i.e. we only did parsing) mostly lower the total,
	// but to get some semblance of forward progress in the total,
	// increment the progress by 1 for every 100 skipped pipelines.
	// This is mostly relevant for cached pipeline replays.
	constexpr unsigned SkipWeightDivider = 100;

	// If we have crashes or other unexpected behavior, these values might increase beyond the expected value.
	// Just clamp it to never report obviously wrong values.
	// The only glitch we risk is that we're stuck at "100%" a bit longer,
	// but UI can always report something here when we know we're not done yet.

	// To aim for good forward progress metrics, skipped or cached pipelines where we're not doing anything useful should subtract from the total instead.
	unsigned skipped_graphics = progress.graphics.cached + progress.graphics.skipped;
	unsigned total_work_graphics = progress.total_graphics_pipeline_blobs -
	                               (std::min)(progress.total_graphics_pipeline_blobs, skipped_graphics);
	unsigned weighted_skipped_graphics = (skipped_graphics + SkipWeightDivider - 1) / SkipWeightDivider;

	unsigned skipped_compute = progress.compute.cached + progress.compute.skipped;
	unsigned total_work_compute = progress.total_compute_pipeline_blobs -
	                              (std::min)(progress.total_compute_pipeline_blobs, skipped_compute);
	unsigned weighted_skipped_compute = (skipped_compute + SkipWeightDivider - 1) / SkipWeightDivider;

	unsigned skipped_raytracing = progress.raytracing.cached + progress.raytracing.skipped;
	unsigned total_work_raytracing = progress.total_raytracing_pipeline_blobs -
	                                 (std::min)(progress.total_raytracing_pipeline_blobs, skipped_raytracing);
	unsigned weighted_skipped_raytracing = (skipped_raytracing + SkipWeightDivider - 1) / SkipWeightDivider;

	unsigned decompressed_modules = (std::min)(progress.completed_modules + progress.module_validation_failures +
	                                           progress.banned_modules + progress.missing_modules, progress.total_modules);
	unsigned weighted_decompressed_modules = (decompressed_modules + ModuleWeightDivider - 1) / ModuleWeightDivider;

	unsigned compiled_graphics = (std::min)(progress.graphics.completed, total_work_graphics);
	unsigned compiled_compute = (std::min)(progress.compute.completed, total_work_compute);
	unsigned compiled_raytracing = (std::min)(progress.raytracing.completed, total_work_raytracing);

	completed = compiled_graphics + compiled_compute + compiled_raytracing + weighted_decompressed_modules;
	total = total_work_graphics + total_work_compute + total_work_raytracing + weighted_total_modules;

	unsigned total_weighted_skipped = weighted_skipped_graphics + weighted_skipped_compute + weighted_skipped_raytracing;
	completed += total_weighted_skipped;
	total += total_weighted_skipped;
}